

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleMeshNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  bool bVar1;
  aiMesh *this_00;
  size_type sVar2;
  Property *prop_00;
  Logger *this_01;
  basic_formatter *this_02;
  DDLNode *this_03;
  string *__k;
  mapped_type_conflict3 *pmVar3;
  string *name;
  DDLNode *parent;
  string local_a0;
  undefined1 local_70 [8];
  string propKey;
  string propName;
  Property *prop;
  size_t meshidx;
  aiScene *pScene_local;
  DDLNode *node_local;
  OpenGEXImporter *this_local;
  
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  this->m_currentMesh = this_00;
  sVar2 = std::
          vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
          ::size(&this->m_meshCache);
  std::
  vector<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>,std::allocator<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>>
  ::emplace_back<aiMesh*&>
            ((vector<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>,std::allocator<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>>
              *)&this->m_meshCache,&this->m_currentMesh);
  prop_00 = ODDLParser::DDLNode::getProperties(node);
  if (prop_00 != (Property *)0x0) {
    std::__cxx11::string::string((string *)(propKey.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_70);
    propId2StdString(prop_00,(string *)(propKey.field_2._M_local_buf + 8),(string *)local_70);
    bVar1 = std::operator==("primitive",
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&propKey.field_2 + 8));
    if (bVar1) {
      bVar1 = std::operator==("points",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_70);
      if (bVar1) {
        this->m_currentMesh->mPrimitiveTypes = this->m_currentMesh->mPrimitiveTypes | 1;
      }
      else {
        bVar1 = std::operator==("lines",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_70);
        if (bVar1) {
          this->m_currentMesh->mPrimitiveTypes = this->m_currentMesh->mPrimitiveTypes | 2;
        }
        else {
          bVar1 = std::operator==("triangles",
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_70);
          if (bVar1) {
            this->m_currentMesh->mPrimitiveTypes = this->m_currentMesh->mPrimitiveTypes | 4;
          }
          else {
            bVar1 = std::operator==("quads",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_70);
            if (bVar1) {
              this->m_currentMesh->mPrimitiveTypes = this->m_currentMesh->mPrimitiveTypes | 8;
            }
            else {
              this_01 = DefaultLogger::get();
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              basic_formatter<std::__cxx11::string>
                        ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &parent,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_70);
              this_02 = (basic_formatter *)
                        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                        ::operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                     *)&parent,(char (*) [34])" is not supported primitive type.");
              Formatter::basic_formatter::operator_cast_to_string(&local_a0,this_02);
              Logger::warn(this_01,&local_a0);
              std::__cxx11::string::~string((string *)&local_a0);
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                *)&parent);
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)(propKey.field_2._M_local_buf + 8));
  }
  handleNodes(this,node,pScene);
  this_03 = ODDLParser::DDLNode::getParent(node);
  if (this_03 != (DDLNode *)0x0) {
    __k = ODDLParser::DDLNode::getName_abi_cxx11_(this_03);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](&this->m_mesh2refMap,__k);
    *pmVar3 = sVar2;
  }
  return;
}

Assistant:

void OpenGEXImporter::handleMeshNode( ODDLParser::DDLNode *node, aiScene *pScene ) {
    m_currentMesh = new aiMesh;
    const size_t meshidx( m_meshCache.size() );
    // ownership is transferred but a reference remains in m_currentMesh
    m_meshCache.emplace_back( m_currentMesh );

    Property *prop = node->getProperties();
    if( nullptr != prop ) {
        std::string propName, propKey;
        propId2StdString( prop, propName, propKey );
        if( "primitive" == propName ) {
            if ( "points" == propKey ) {
                m_currentMesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
            } else if ( "lines" == propKey ) {
                m_currentMesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
            } else if( "triangles" == propKey ) {
                m_currentMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
            } else if ( "quads" == propKey ) {
                m_currentMesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
            } else {
                ASSIMP_LOG_WARN_F( propKey, " is not supported primitive type." );
            }
        }
    }

    handleNodes( node, pScene );

    DDLNode *parent( node->getParent() );
    if( nullptr != parent ) {
        const std::string &name = parent->getName();
        m_mesh2refMap[ name ] = meshidx;
    }
}